

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemParse.cpp
# Opt level: O3

int main(int argC,char **argV)

{
  char cVar1;
  int iVar2;
  SAXParser *this;
  MemBufInputSource *this_00;
  ostream *poVar3;
  size_t sVar4;
  char *pcVar5;
  ErrorHandler *pEVar6;
  bool bVar7;
  char *pcVar8;
  ulong uVar9;
  MemParseHandlers handler;
  MemParseHandlers local_70;
  
  pcVar5 = (char *)0x0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (1 < argC) {
    uVar9 = 1;
    do {
      pcVar8 = argV[uVar9];
      if ((*pcVar8 != '-') || ((pcVar8[1] == '?' && (pcVar8[2] == '\0')))) {
        usage();
        xercesc_4_0::XMLPlatformUtils::Terminate();
        return 1;
      }
      if (((pcVar8[1] == 'v') && (pcVar8[2] == '=')) || ((pcVar8[1] == 'V' && (pcVar8[2] == '='))))
      {
        pcVar8 = pcVar8 + 3;
        pcVar5 = "never";
        iVar2 = strcmp(pcVar8,"never");
        if (iVar2 != 0) {
          pcVar5 = "auto";
          iVar2 = strcmp(pcVar8,"auto");
          if (iVar2 != 0) {
            pcVar5 = "always";
            iVar2 = strcmp(pcVar8,"always");
            if (iVar2 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Unknown -v= value: ",0x13);
              sVar4 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar4)
              ;
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
              std::ostream::put('H');
              std::ostream::flush();
              return 2;
            }
          }
        }
      }
      else if ((((pcVar8[1] != 'n') || (pcVar8[2] != '\0')) &&
               (((pcVar8[1] != 'N' || (pcVar8[2] != '\0')) &&
                ((pcVar8[1] != 's' || (pcVar8[2] != '\0')))))) &&
              (((pcVar8[1] != 'S' || (pcVar8[2] != '\0')) &&
               (((pcVar8[1] != 'f' || (pcVar8[2] != '\0')) &&
                ((pcVar8[1] != 'F' || (pcVar8[2] != '\0')))))))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown option \'",0x10);
        pcVar5 = argV[uVar9];
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108148);
        }
        else {
          sVar4 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\', ignoring it\n",0xf);
        cVar1 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
        pcVar5 = (char *)(ulong)(uint)(int)cVar1;
        std::ostream::put('H');
        std::ostream::flush();
      }
      uVar9 = uVar9 + 1;
    } while ((uint)argC != uVar9);
  }
  this = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,(ulong)pcVar5);
  xercesc_4_0::SAXParser::SAXParser
            (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this);
  bVar7 = SUB81(this,0);
  xercesc_4_0::SAXParser::setDoNamespaces(bVar7);
  xercesc_4_0::SAXParser::setDoSchema(bVar7);
  xercesc_4_0::SAXParser::setHandleMultipleImports(bVar7);
  xercesc_4_0::SAXParser::setValidationSchemaFullChecking(bVar7);
  MemParseHandlers::MemParseHandlers(&local_70);
  (**(code **)(*(long *)this + 0x20))(this,&local_70.super_HandlerBase.super_DocumentHandler);
  pEVar6 = &local_70.super_HandlerBase.super_ErrorHandler;
  (**(code **)(*(long *)this + 0x28))(this);
  this_00 = (MemBufInputSource *)xercesc_4_0::XMemory::operator_new((XMemory *)0x48,(ulong)pEVar6);
  xercesc_4_0::MemBufInputSource::MemBufInputSource
            (this_00,(uchar *)
                     "<?xml version=\'1.0\' encoding=\'ascii\'?>\n<!DOCTYPE company [\n<!ELEMENT company     (product,category,developedAt)>\n<!ELEMENT product     (#PCDATA)>\n<!ELEMENT category    (#PCDATA)>\n<!ATTLIST category idea CDATA #IMPLIED>\n<!ELEMENT developedAt (#PCDATA)>\n]>\n\n<company>\n    <product>XML4C</product>\n    <category idea=\'great\'>XML Parsing Tools</category>\n    <developedAt>\n      IBM Center for Java Technology, Silicon Valley, Cupertino, CA\n    </developedAt>\n</company>"
             ,0x1d2,"prodInfo",false,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
  (**(code **)(*(long *)this + 0x30))(this,this_00);
  xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
  iVar2 = xercesc_4_0::SAXParser::getErrorCount();
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\nFinished parsing the memory buffer containing the following ",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"XML statements:\n\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "<?xml version=\'1.0\' encoding=\'ascii\'?>\n<!DOCTYPE company [\n<!ELEMENT company     (product,category,developedAt)>\n<!ELEMENT product     (#PCDATA)>\n<!ELEMENT category    (#PCDATA)>\n<!ATTLIST category idea CDATA #IMPLIED>\n<!ELEMENT developedAt (#PCDATA)>\n]>\n\n<company>\n    <product>XML4C</product>\n    <category idea=\'great\'>XML Parsing Tools</category>\n    <developedAt>\n      IBM Center for Java Technology, Silicon Valley, Cupertino, CA\n    </developedAt>\n</company>"
               ,0x1d2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parsing took ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ms (",5);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," elements, ",0xb);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," attributes, ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," spaces, ",9);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," characters).\n",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  (**(code **)(*(long *)this + 8))(this);
  (**(code **)(*(long *)this_00 + 8))(this_00);
  xercesc_4_0::XMLPlatformUtils::Terminate();
  MemParseHandlers::~MemParseHandlers(&local_70);
  return (uint)(0 < iVar2) << 2;
}

Assistant:

int main(int argC, char* argV[])
{
    // Initialize the XML4C2 system
    try
    {
         XMLPlatformUtils::Initialize();
    }
    catch (const XMLException& toCatch)
    {
         std::cerr << "Error during initialization! Message:\n"
              << StrX(toCatch.getMessage()) << std::endl;
         return 1;
    }

    SAXParser::ValSchemes    valScheme = SAXParser::Val_Auto;
    bool doNamespaces       = false;
    bool doSchema           = false;
    bool schemaFullChecking = false;

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 1;
        }

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 1;
        }
         else if (!strncmp(argV[argInd], "-v=", 3)
              ||  !strncmp(argV[argInd], "-V=", 3))
        {
            const char* const parm = &argV[argInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAXParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAXParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAXParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                return 2;
            }
        }
         else if (!strcmp(argV[argInd], "-n")
              ||  !strcmp(argV[argInd], "-N"))
        {
            doNamespaces = true;
        }
         else if (!strcmp(argV[argInd], "-s")
              ||  !strcmp(argV[argInd], "-S"))
        {
            doSchema = true;
        }
         else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                 << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  Create a SAX parser object. Then, according to what we were told on
    //  the command line, set it to validate or not.
    //
    SAXParser* parser = new SAXParser;
    parser->setValidationScheme(valScheme);
    parser->setDoNamespaces(doNamespaces);
    parser->setDoSchema(doSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(schemaFullChecking);

    //
    //  Create our SAX handler object and install it on the parser, as the
    //  document and error handlers.
    //
    MemParseHandlers handler;
    parser->setDocumentHandler(&handler);
    parser->setErrorHandler(&handler);

    //
    //  Create MemBufferInputSource from the buffer containing the XML
    //  statements.
    //
    //  NOTE: We are using strlen() here, since we know that the chars in
    //  our hard coded buffer are single byte chars!!! The parameter wants
    //  the number of BYTES, not chars, so when you create a memory buffer
    //  give it the byte size (which just happens to be the same here.)
    //
    MemBufInputSource* memBufIS = new MemBufInputSource
    (
        (const XMLByte*)gXMLInMemBuf
        , strlen(gXMLInMemBuf)
        , gMemBufId
        , false
    );

    //
    //  Get the starting time and kick off the parse of the indicated
    //  file. Catch any exceptions that might propogate out of it.
    //
    unsigned long duration;
    int errorCount = 0;
    int errorCode = 0;
    try
    {
        const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
        parser->parse(*memBufIS);
        const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
        duration = endMillis - startMillis;
        errorCount = parser->getErrorCount();
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException" << std::endl;
        errorCode = 5;
    }
    catch (const XMLException& e)
    {
        std::cerr << "\nError during parsing memory stream:\n"
             << "Exception message is:  \n"
             << StrX(e.getMessage()) << "\n" << std::endl;
        errorCode = 4;
    }
    if(errorCode) {
        XMLPlatformUtils::Terminate();
        return errorCode;
    }

    // Print out the stats that we collected and time taken.
    if (!errorCount) {
        std::cout << "\nFinished parsing the memory buffer containing the following "
             << "XML statements:\n\n"
             << gXMLInMemBuf
             << "\n\n\n"
             << "Parsing took " << duration << " ms ("
             << handler.getElementCount() << " elements, "
             << handler.getAttrCount() << " attributes, "
             << handler.getSpaceCount() << " spaces, "
             << handler.getCharacterCount() << " characters).\n" << std::endl;
    }

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    delete memBufIS;

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorCount > 0)
        return 4;
    else
        return 0;
}